

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.h
# Opt level: O1

void __thiscall beagle::plugin::Plugin::~Plugin(Plugin *this)

{
  pointer pcVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  this->_vptr_Plugin = (_func_int **)&PTR_pluginName_abi_cxx11__0014c528;
  pcVar1 = (this->m_plugin_type)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_plugin_type).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_plugin_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_plugin_name).field_2) {
    operator_delete(pcVar1);
  }
  p_Var3 = (this->beagleResources).super__List_base<BeagleResource,_std::allocator<BeagleResource>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->beagleResources) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var2;
  }
  p_Var3 = (this->beagleFactories).
           super__List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->beagleFactories) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var2;
  }
  return;
}

Assistant:

class BEAGLE_DLLEXPORT Plugin
{
  public:
	Plugin() {}

    Plugin(const char* plugin_name, const char* plugin_type)
    : m_plugin_name(plugin_name), m_plugin_type(plugin_type) {}

    virtual std::string pluginName() const{ return m_plugin_name; }
    virtual std::string pluginType() const{ return m_plugin_type; }

    virtual const std::list<beagle::BeagleImplFactory*>& getBeagleFactories() const{ return beagleFactories; }
    virtual const std::list<BeagleResource>& getBeagleResources() const{ return beagleResources; }

protected:
    std::list<beagle::BeagleImplFactory*> beagleFactories;
    std::list<BeagleResource> beagleResources;
    std::string m_plugin_name;
    std::string m_plugin_type;
}